

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O0

void Int24_To_Int16_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  byte bVar1;
  byte bVar2;
  PaInt16 PVar3;
  PaInt32 PVar4;
  PaInt32 dither;
  PaInt32 temp;
  PaInt16 *dest;
  uchar *src;
  PaUtilTriangularDitherGenerator *ditherGenerator_local;
  uint count_local;
  int sourceStride_local;
  void *sourceBuffer_local;
  int destinationStride_local;
  void *destinationBuffer_local;
  
  _dither = (undefined2 *)destinationBuffer;
  dest = (PaInt16 *)sourceBuffer;
  ditherGenerator_local._0_4_ = count;
  while ((uint)ditherGenerator_local != 0) {
    PVar3 = *dest;
    bVar1 = *(byte *)((long)dest + 1);
    bVar2 = *(byte *)(dest + 1);
    PVar4 = PaUtil_Generate16BitTriangularDither(ditherGenerator);
    *_dither = (short)(((int)((uint)(byte)PVar3 << 8 | (uint)bVar1 << 0x10 | (uint)bVar2 << 0x18) >>
                       1) + PVar4 >> 0xf);
    dest = (PaInt16 *)((long)dest + (long)(sourceStride * 3));
    _dither = _dither + destinationStride;
    ditherGenerator_local._0_4_ = (uint)ditherGenerator_local - 1;
  }
  return;
}

Assistant:

static void Int24_To_Int16_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char *)sourceBuffer;
    PaInt16 *dest = (PaInt16 *)destinationBuffer;

    PaInt32 temp, dither;

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (PaInt16) (((temp >> 1) + dither) >> 15);

        src += sourceStride * 3;
        dest += destinationStride;
    }
}